

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O0

Status __thiscall
leveldb::BuildTable(leveldb *this,string *dbname,Env *env,Options *options,TableCache *table_cache,
                   Iterator *iter,FileMetaData *meta)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  TableBuilder *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar4;
  Status local_118;
  Status local_110;
  Status local_108;
  Status local_100;
  ReadOptions local_f8;
  Iterator *local_e0;
  Iterator *it;
  Status local_d0;
  TableBuilder local_c8;
  Slice local_c0;
  undefined1 local_b0 [8];
  Slice key;
  TableBuilder *builder;
  Status local_80;
  WritableFile *local_78;
  WritableFile *file;
  string fname;
  Iterator *iter_local;
  TableCache *table_cache_local;
  Options *options_local;
  Env *env_local;
  string *dbname_local;
  Status *s;
  
  Status::Status((Status *)this);
  meta->file_size = 0;
  (*iter->_vptr_Iterator[3])();
  TableFileName((leveldb *)&file,dbname,meta->number);
  uVar2 = (*iter->_vptr_Iterator[2])();
  if ((uVar2 & 1) != 0) {
    (*env->_vptr_Env[4])(&local_80,env,&file,&local_78);
    Status::operator=((Status *)this,&local_80);
    Status::~Status(&local_80);
    bVar1 = Status::ok((Status *)this);
    if (!bVar1) goto LAB_00142511;
    this_00 = (TableBuilder *)operator_new(8);
    TableBuilder::TableBuilder(this_00,options,local_78);
    iVar3 = (*iter->_vptr_Iterator[8])();
    key.size_ = CONCAT44(extraout_var,iVar3);
    InternalKey::DecodeFrom(&meta->smallest,(Slice *)&key.size_);
    while (uVar2 = (*iter->_vptr_Iterator[2])(), (uVar2 & 1) != 0) {
      iVar3 = (*iter->_vptr_Iterator[8])();
      local_b0 = (undefined1  [8])CONCAT44(extraout_var_00,iVar3);
      InternalKey::DecodeFrom(&meta->largest,(Slice *)local_b0);
      iVar3 = (*iter->_vptr_Iterator[9])();
      local_c0.data_ = (char *)CONCAT44(extraout_var_01,iVar3);
      TableBuilder::Add(this_00,(Slice *)local_b0,&local_c0);
      (*iter->_vptr_Iterator[6])();
    }
    TableBuilder::Finish(&local_c8);
    Status::operator=((Status *)this,(Status *)&local_c8);
    Status::~Status((Status *)&local_c8);
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      uVar4 = TableBuilder::FileSize(this_00);
      meta->file_size = uVar4;
      if (meta->file_size == 0) {
        __assert_fail("meta->file_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/builder.cc"
                      ,0x2b,
                      "Status leveldb::BuildTable(const std::string &, Env *, const Options &, TableCache *, Iterator *, FileMetaData *)"
                     );
      }
    }
    if (this_00 != (TableBuilder *)0x0) {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      (*local_78->_vptr_WritableFile[5])(&local_d0);
      Status::operator=((Status *)this,&local_d0);
      Status::~Status(&local_d0);
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      (*local_78->_vptr_WritableFile[3])(&it);
      Status::operator=((Status *)this,(Status *)&it);
      Status::~Status((Status *)&it);
    }
    if (local_78 != (WritableFile *)0x0) {
      (*local_78->_vptr_WritableFile[1])();
    }
    local_78 = (WritableFile *)0x0;
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      local_f8.verify_checksums = false;
      local_f8.fill_cache = false;
      local_f8._2_6_ = 0;
      local_f8.snapshot = (Snapshot *)0x0;
      ReadOptions::ReadOptions(&local_f8);
      local_e0 = TableCache::NewIterator
                           (table_cache,&local_f8,meta->number,meta->file_size,(Table **)0x0);
      (*local_e0->_vptr_Iterator[10])(&local_100);
      Status::operator=((Status *)this,&local_100);
      Status::~Status(&local_100);
      if (local_e0 != (Iterator *)0x0) {
        (*local_e0->_vptr_Iterator[1])();
      }
    }
  }
  (*iter->_vptr_Iterator[10])(&local_108);
  bVar1 = Status::ok(&local_108);
  Status::~Status(&local_108);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    (*iter->_vptr_Iterator[10])(&local_110);
    Status::operator=((Status *)this,&local_110);
    Status::~Status(&local_110);
  }
  bVar1 = Status::ok((Status *)this);
  if ((!bVar1) || (meta->file_size == 0)) {
    (*env->_vptr_Env[8])(&local_118,env,&file);
    Status::~Status(&local_118);
  }
LAB_00142511:
  std::__cxx11::string::~string((string *)&file);
  return (Status)(char *)this;
}

Assistant:

Status BuildTable(const std::string& dbname, Env* env, const Options& options,
                  TableCache* table_cache, Iterator* iter, FileMetaData* meta) {
  Status s;
  meta->file_size = 0;
  iter->SeekToFirst();

  std::string fname = TableFileName(dbname, meta->number);
  if (iter->Valid()) {
    WritableFile* file;
    s = env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      return s;
    }

    TableBuilder* builder = new TableBuilder(options, file);
    meta->smallest.DecodeFrom(iter->key());
    for (; iter->Valid(); iter->Next()) {
      Slice key = iter->key();
      meta->largest.DecodeFrom(key);
      builder->Add(key, iter->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      meta->file_size = builder->FileSize();
      assert(meta->file_size > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    if (s.ok()) {
      // Verify that the table is usable
      Iterator* it = table_cache->NewIterator(ReadOptions(), meta->number,
                                              meta->file_size);
      s = it->status();
      delete it;
    }
  }

  // Check for input iterator errors
  if (!iter->status().ok()) {
    s = iter->status();
  }

  if (s.ok() && meta->file_size > 0) {
    // Keep it
  } else {
    env->DeleteFile(fname);
  }
  return s;
}